

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

unique_ptr<pbrt::AOIntegrator,_std::default_delete<pbrt::AOIntegrator>_>
pbrt::AOIntegrator::Create
          (ParameterDictionary *parameters,SpectrumHandle *illuminant,CameraHandle *camera,
          SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights,FileLoc *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool cosSample;
  Float local_6c;
  string local_68;
  CameraHandle *local_48;
  FileLoc *local_40;
  Float maxDist;
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  local_48 = camera;
  local_40 = loc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cossample","");
  cosSample = ParameterDictionary::GetOneBool((ParameterDictionary *)illuminant,&local_68,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"maxdistance","");
  maxDist = ParameterDictionary::GetOneFloat((ParameterDictionary *)illuminant,&local_68,INFINITY);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    local_6c = maxDist;
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    maxDist = local_6c;
  }
  std::
  make_unique<pbrt::AOIntegrator,bool&,float&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,pbrt::SpectrumHandle&>
            ((bool *)parameters,(float *)&cosSample,(CameraHandle *)&maxDist,sampler,aggregate,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_40,
             (SpectrumHandle *)
             lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
             _M_impl.super__Vector_impl_data._M_start);
  return (__uniq_ptr_data<pbrt::AOIntegrator,_std::default_delete<pbrt::AOIntegrator>,_true,_true>)
         (__uniq_ptr_data<pbrt::AOIntegrator,_std::default_delete<pbrt::AOIntegrator>,_true,_true>)
         parameters;
}

Assistant:

std::unique_ptr<AOIntegrator> AOIntegrator::Create(
    const ParameterDictionary &parameters, SpectrumHandle illuminant, CameraHandle camera,
    SamplerHandle sampler, PrimitiveHandle aggregate, std::vector<LightHandle> lights,
    const FileLoc *loc) {
    bool cosSample = parameters.GetOneBool("cossample", true);
    Float maxDist = parameters.GetOneFloat("maxdistance", Infinity);
    return std::make_unique<AOIntegrator>(cosSample, maxDist, camera, sampler, aggregate,
                                          lights, illuminant);
}